

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void sort_column(Matrix<double> *mat,uint col,uint beg_row,uint end_row)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  pointer ppVar7;
  double *pdVar8;
  __normal_iterator<std::pair<unsigned_int,_double>_*,_std::vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>_>
  __i;
  long lVar9;
  pointer ppVar10;
  double dVar11;
  vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_> vps;
  vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
  local_40;
  
  get_vps(&local_40,mat,col,beg_row,end_row);
  ppVar7 = local_40.
           super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_40.
      super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar9 = (long)local_40.
                  super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_40.
                  super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = lVar9 >> 4;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,double>*,std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<sort_column(Matrix<double>&,unsigned_int,unsigned_int,unsigned_int)::__0>>
              (local_40.
               super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_40.
               super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar9 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,double>*,std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<sort_column(Matrix<double>&,unsigned_int,unsigned_int,unsigned_int)::__0>>
                (ppVar7,local_40.
                        super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      ppVar10 = ppVar7 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,double>*,std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<sort_column(Matrix<double>&,unsigned_int,unsigned_int,unsigned_int)::__0>>
                (ppVar7,ppVar10);
      if (ppVar10 !=
          local_40.
          super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pdVar8 = &ppVar7[0x10].second;
        do {
          uVar2 = ppVar10->first;
          dVar1 = ppVar10->second;
          dVar11 = ppVar10[-1].second;
          ppVar7 = ppVar10;
          pdVar4 = pdVar8;
          if (dVar1 < dVar11) {
            do {
              pdVar6 = pdVar4;
              ((pair<unsigned_int,_double> *)(pdVar6 + -1))->first = *(uint *)(pdVar6 + -3);
              *pdVar6 = dVar11;
              dVar11 = pdVar6[-4];
              pdVar4 = pdVar6 + -2;
            } while (dVar1 < dVar11);
            ppVar7 = (pointer)(pdVar6 + -3);
          }
          ppVar7->first = uVar2;
          ppVar7->second = dVar1;
          ppVar10 = ppVar10 + 1;
          pdVar8 = pdVar8 + 2;
        } while (ppVar10 !=
                 local_40.
                 super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
  modify_vps(mat,&local_40,beg_row);
  if (local_40.
      super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sort_column(Matrix_d& mat, unsigned col, unsigned beg_row, unsigned end_row){
    std::vector<std::pair<unsigned, double>> vps=get_vps(mat, col, beg_row, end_row);
    
    std::sort(vps.begin(), vps.end(), 
        [](const std::pair<unsigned, double>& vp1, const std::pair<unsigned, double>& vp2)->bool{
            return vp1.second<vp2.second;
        }
    );

    modify_vps(mat, vps, beg_row);
}